

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_content_chunked<httplib::Response>
               (Stream *strm,Response *x,ContentReceiverWithProgress *out)

{
  char *pcVar1;
  bool bVar2;
  __ssize_t _Var3;
  char **__lineptr;
  string *psVar4;
  size_t sVar5;
  FILE *pFVar6;
  size_t *__n;
  size_t *__n_00;
  size_t *__n_01;
  size_t *__n_02;
  char **__endptr;
  char **ppcVar7;
  stream_line_reader line_reader;
  char *end_ptr;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  char buf [16];
  
  line_reader.fixed_buffer_ = buf;
  line_reader.fixed_buffer_size_ = 0x10;
  line_reader.fixed_buffer_used_size_ = 0;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)&line_reader.glowable_buffer_.field_2;
  line_reader.glowable_buffer_._M_string_length = 0;
  line_reader.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  line_reader.strm_ = strm;
  _Var3 = stream_line_reader::getline
                    (&line_reader,(char **)x,(size_t *)out,(FILE *)&line_reader.glowable_buffer_);
  if ((char)_Var3 != '\0') {
    ppcVar7 = &line_reader.fixed_buffer_;
    while( true ) {
      psVar4 = &line_reader.glowable_buffer_;
      if (line_reader.glowable_buffer_._M_string_length == 0) {
        psVar4 = (string *)ppcVar7;
      }
      __endptr = &end_ptr;
      __lineptr = (char **)strtoul((psVar4->_M_dataplus)._M_p,__endptr,0x10);
      psVar4 = (string *)ppcVar7;
      if (line_reader.glowable_buffer_._M_string_length != 0) {
        psVar4 = &line_reader.glowable_buffer_;
      }
      if ((end_ptr == (psVar4->_M_dataplus)._M_p) || (__lineptr == (char **)0xffffffffffffffff))
      goto LAB_00138d40;
      if (__lineptr == (char **)0x0) break;
      local_78 = 0;
      uStack_70 = 0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                 &stack0xffffffffffffffb0,out);
      pFVar6 = (FILE *)&stack0xffffffffffffffb0;
      bVar2 = read_content_with_length
                        (strm,(uint64_t)__lineptr,(Progress *)&local_88,
                         (ContentReceiverWithProgress *)&stack0xffffffffffffffb0);
      std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      if ((!bVar2) ||
         (_Var3 = stream_line_reader::getline(&line_reader,__lineptr,__n_00,pFVar6),
         (char)_Var3 == '\0')) goto LAB_00138d40;
      psVar4 = &line_reader.glowable_buffer_;
      if (line_reader.glowable_buffer_._M_string_length == 0) {
        psVar4 = (string *)ppcVar7;
      }
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      if (((*pcVar1 != '\r') || (pcVar1[1] != '\n')) ||
         ((pcVar1[2] != '\0' ||
          (_Var3 = stream_line_reader::getline(&line_reader,__lineptr,__n_01,pFVar6),
          (char)_Var3 == '\0')))) goto LAB_00138d40;
    }
    _Var3 = stream_line_reader::getline(&line_reader,__endptr,__n,(FILE *)end_ptr);
    if ((char)_Var3 != '\0') {
      bVar2 = false;
      goto LAB_00138ced;
    }
  }
LAB_00138d40:
  bVar2 = false;
  goto LAB_00138d42;
  while( true ) {
    sVar5 = line_reader.glowable_buffer_._M_string_length;
    if (line_reader.glowable_buffer_._M_string_length == 0) {
      sVar5 = line_reader.fixed_buffer_used_size_;
    }
    if (0x2000 < sVar5) goto LAB_00138d40;
    ppcVar7 = (char **)(pcVar1 + (sVar5 - 2));
    parse_header<httplib::detail::read_content_chunked<httplib::Response>(httplib::Stream&,httplib::Response&,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
              (pcVar1,(char *)ppcVar7,(anon_class_8_1_54a39818)x);
    _Var3 = stream_line_reader::getline(&line_reader,ppcVar7,__n_02,pFVar6);
    if ((char)_Var3 == '\0') break;
LAB_00138ced:
    pFVar6 = (FILE *)&line_reader.glowable_buffer_;
    if (line_reader.glowable_buffer_._M_string_length == 0) {
      pFVar6 = (FILE *)&line_reader.fixed_buffer_;
    }
    pcVar1 = *(char **)pFVar6;
    if (((*pcVar1 == '\r') && (pcVar1[1] == '\n')) && (pcVar1[2] == '\0')) {
      bVar2 = true;
      break;
    }
  }
LAB_00138d42:
  std::__cxx11::string::~string((string *)&line_reader.glowable_buffer_);
  return bVar2;
}

Assistant:

inline bool read_content_chunked(Stream &strm, T &x,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { return false; }

    if (!line_reader.getline()) { return false; }
  }

  assert(chunk_len == 0);

  // Trailer
  if (!line_reader.getline()) { return false; }

  while (strcmp(line_reader.ptr(), "\r\n")) {
    if (line_reader.size() > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }

    // Exclude line terminator
    constexpr auto line_terminator_len = 2;
    auto end = line_reader.ptr() + line_reader.size() - line_terminator_len;

    parse_header(line_reader.ptr(), end,
                 [&](std::string &&key, std::string &&val) {
                   x.headers.emplace(std::move(key), std::move(val));
                 });

    if (!line_reader.getline()) { return false; }
  }

  return true;
}